

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cftmdl(int n,int l,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk3i;
  double wk3r;
  double wk2i;
  double wk2r;
  double wk1i;
  double wk1r;
  int m2;
  int m;
  int k2;
  int k1;
  int k;
  int j3;
  int j2;
  int j1;
  int j;
  double *w_local;
  double *a_local;
  int l_local;
  int n_local;
  
  for (j2 = 0; j2 < l; j2 = j2 + 2) {
    iVar17 = j2 + l;
    iVar18 = iVar17 + l;
    iVar19 = iVar18 + l;
    dVar1 = a[j2];
    dVar22 = a[iVar17];
    dVar23 = a[j2 + 1];
    dVar2 = a[iVar17 + 1];
    dVar24 = a[j2];
    dVar25 = a[iVar17];
    dVar26 = a[j2 + 1];
    dVar27 = a[iVar17 + 1];
    dVar3 = a[iVar18];
    dVar4 = a[iVar19];
    dVar5 = a[iVar18 + 1];
    dVar6 = a[iVar19 + 1];
    dVar7 = a[iVar18];
    dVar8 = a[iVar19];
    dVar9 = a[iVar18 + 1];
    dVar10 = a[iVar19 + 1];
    a[j2] = dVar1 + dVar22 + dVar3 + dVar4;
    a[j2 + 1] = dVar23 + dVar2 + dVar5 + dVar6;
    a[iVar18] = (dVar1 + dVar22) - (dVar3 + dVar4);
    a[iVar18 + 1] = (dVar23 + dVar2) - (dVar5 + dVar6);
    a[iVar17] = (dVar24 - dVar25) - (dVar9 - dVar10);
    a[iVar17 + 1] = (dVar26 - dVar27) + (dVar7 - dVar8);
    a[iVar19] = (dVar24 - dVar25) + (dVar9 - dVar10);
    a[iVar19 + 1] = (dVar26 - dVar27) - (dVar7 - dVar8);
  }
  dVar1 = w[2];
  for (j2 = l * 4; j2 < l * 5; j2 = j2 + 2) {
    iVar17 = j2 + l;
    iVar18 = iVar17 + l;
    iVar19 = iVar18 + l;
    dVar22 = a[j2];
    dVar23 = a[iVar17];
    dVar2 = a[j2 + 1];
    dVar24 = a[iVar17 + 1];
    dVar25 = a[j2];
    dVar26 = a[iVar17];
    dVar27 = a[j2 + 1];
    dVar3 = a[iVar17 + 1];
    dVar4 = a[iVar18];
    dVar5 = a[iVar19];
    dVar6 = a[iVar18 + 1];
    dVar7 = a[iVar19 + 1];
    dVar8 = a[iVar18];
    dVar9 = a[iVar19];
    dVar10 = a[iVar18 + 1];
    dVar11 = a[iVar19 + 1];
    a[j2] = dVar22 + dVar23 + dVar4 + dVar5;
    a[j2 + 1] = dVar2 + dVar24 + dVar6 + dVar7;
    a[iVar18] = (dVar6 + dVar7) - (dVar2 + dVar24);
    a[iVar18 + 1] = (dVar22 + dVar23) - (dVar4 + dVar5);
    dVar22 = (dVar25 - dVar26) - (dVar10 - dVar11);
    dVar23 = (dVar27 - dVar3) + (dVar8 - dVar9);
    a[iVar17] = dVar1 * (dVar22 - dVar23);
    a[iVar17 + 1] = dVar1 * (dVar22 + dVar23);
    dVar22 = (dVar10 - dVar11) + (dVar25 - dVar26);
    dVar23 = (dVar8 - dVar9) - (dVar27 - dVar3);
    a[iVar19] = dVar1 * (dVar23 - dVar22);
    a[iVar19 + 1] = dVar1 * (dVar23 + dVar22);
  }
  m = 0;
  for (k2 = l * 8; k2 < n; k2 = l * 8 + k2) {
    iVar17 = m + 2;
    iVar18 = iVar17 * 2;
    dVar1 = w[iVar17];
    dVar22 = w[m + 3];
    dVar23 = w[iVar18];
    dVar2 = w[iVar18 + 1];
    dVar24 = -(dVar22 * 2.0) * dVar2 + dVar23;
    dVar25 = dVar22 * 2.0 * dVar23 + -dVar2;
    for (j2 = k2; j2 < l + k2; j2 = j2 + 2) {
      iVar19 = j2 + l;
      iVar20 = iVar19 + l;
      iVar21 = iVar20 + l;
      dVar26 = a[j2];
      dVar27 = a[iVar19];
      dVar3 = a[j2 + 1];
      dVar4 = a[iVar19 + 1];
      dVar5 = a[j2];
      dVar6 = a[iVar19];
      dVar7 = a[j2 + 1];
      dVar8 = a[iVar19 + 1];
      dVar9 = a[iVar20];
      dVar10 = a[iVar21];
      dVar11 = a[iVar20 + 1];
      dVar12 = a[iVar21 + 1];
      dVar13 = a[iVar20];
      dVar14 = a[iVar21];
      dVar15 = a[iVar20 + 1];
      dVar16 = a[iVar21 + 1];
      a[j2] = dVar26 + dVar27 + dVar9 + dVar10;
      a[j2 + 1] = dVar3 + dVar4 + dVar11 + dVar12;
      dVar26 = (dVar26 + dVar27) - (dVar9 + dVar10);
      dVar27 = (dVar3 + dVar4) - (dVar11 + dVar12);
      a[iVar20] = dVar1 * dVar26 + -(dVar22 * dVar27);
      a[iVar20 + 1] = dVar1 * dVar27 + dVar22 * dVar26;
      dVar26 = (dVar5 - dVar6) - (dVar15 - dVar16);
      dVar27 = (dVar7 - dVar8) + (dVar13 - dVar14);
      a[iVar19] = dVar23 * dVar26 + -(dVar2 * dVar27);
      a[iVar19 + 1] = dVar23 * dVar27 + dVar2 * dVar26;
      dVar26 = (dVar5 - dVar6) + (dVar15 - dVar16);
      dVar27 = (dVar7 - dVar8) - (dVar13 - dVar14);
      a[iVar21] = dVar24 * dVar26 + -(dVar25 * dVar27);
      a[iVar21 + 1] = dVar24 * dVar27 + dVar25 * dVar26;
    }
    dVar23 = w[iVar18 + 2];
    dVar2 = w[iVar18 + 3];
    dVar24 = -(dVar1 * 2.0) * dVar2 + dVar23;
    dVar25 = dVar1 * 2.0 * dVar23 + -dVar2;
    for (j2 = k2 + l * 4; j2 < k2 + l * 5; j2 = j2 + 2) {
      iVar18 = j2 + l;
      iVar19 = iVar18 + l;
      iVar20 = iVar19 + l;
      dVar26 = a[j2];
      dVar27 = a[iVar18];
      dVar3 = a[j2 + 1];
      dVar4 = a[iVar18 + 1];
      dVar5 = a[j2];
      dVar6 = a[iVar18];
      dVar7 = a[j2 + 1];
      dVar8 = a[iVar18 + 1];
      dVar9 = a[iVar19];
      dVar10 = a[iVar20];
      dVar11 = a[iVar19 + 1];
      dVar12 = a[iVar20 + 1];
      dVar13 = a[iVar19];
      dVar14 = a[iVar20];
      dVar15 = a[iVar19 + 1];
      dVar16 = a[iVar20 + 1];
      a[j2] = dVar26 + dVar27 + dVar9 + dVar10;
      a[j2 + 1] = dVar3 + dVar4 + dVar11 + dVar12;
      dVar26 = (dVar26 + dVar27) - (dVar9 + dVar10);
      dVar27 = (dVar3 + dVar4) - (dVar11 + dVar12);
      a[iVar19] = -dVar22 * dVar26 + -(dVar1 * dVar27);
      a[iVar19 + 1] = -dVar22 * dVar27 + dVar1 * dVar26;
      dVar26 = (dVar5 - dVar6) - (dVar15 - dVar16);
      dVar27 = (dVar7 - dVar8) + (dVar13 - dVar14);
      a[iVar18] = dVar23 * dVar26 + -(dVar2 * dVar27);
      a[iVar18 + 1] = dVar23 * dVar27 + dVar2 * dVar26;
      dVar26 = (dVar5 - dVar6) + (dVar15 - dVar16);
      dVar27 = (dVar7 - dVar8) - (dVar13 - dVar14);
      a[iVar20] = dVar24 * dVar26 + -(dVar25 * dVar27);
      a[iVar20 + 1] = dVar24 * dVar27 + dVar25 * dVar26;
    }
    m = iVar17;
  }
  return;
}

Assistant:

void cftmdl(int n, int l, double *a, double *w)
{
    int j, j1, j2, j3, k, k1, k2, m, m2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}